

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

int lj_record_mm_lookup(jit_State *J,RecordIndex *ix,MMS mm)

{
  short sVar1;
  ushort uVar2;
  undefined2 uVar3;
  TRef TVar4;
  cTValue *pcVar5;
  uint in_EDX;
  uint *in_RSI;
  GCobj *in_RDI;
  cTValue *mo_1;
  GCstr *mmstr;
  TRef tr;
  cTValue *mo;
  int udtype;
  GCtab *mt;
  RecordIndex mix;
  undefined8 in_stack_fffffffffffffe28;
  undefined2 in_stack_fffffffffffffe30;
  undefined2 in_stack_fffffffffffffe32;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  IRType in_stack_fffffffffffffe3c;
  uint uVar6;
  jit_State *in_stack_fffffffffffffe40;
  IRType IVar7;
  GCobj *in_stack_fffffffffffffe48;
  undefined6 in_stack_fffffffffffffe50;
  undefined2 in_stack_fffffffffffffe56;
  GCtab *local_170;
  uint local_138;
  uint in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  uint local_104;
  
  if ((in_RSI[0xc] & 0x1f000000) == 0xb000000) {
    local_170 = (GCtab *)(ulong)*(uint *)((ulong)*in_RSI + 0x10);
    uVar6 = in_RSI[0xc];
    *(undefined2 *)((long)in_RDI + 0x9c) = 0x430b;
    *(short *)((long)in_RDI + 0x98) = (short)uVar6;
    *(undefined2 *)((long)in_RDI + 0x9a) = 3;
    local_138 = lj_opt_fold((jit_State *)
                            CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  else {
    if ((in_RSI[0xc] & 0x1f000000) != 0xc000000) {
      in_stack_fffffffffffffe40 = (jit_State *)((long)in_RDI + -0x98);
      if (in_RSI[1] < 0xffff0000) {
        uVar6 = 0xd;
      }
      else if ((int)in_RSI[1] >> 0xf == -2) {
        uVar6 = 3;
      }
      else {
        uVar6 = in_RSI[1] ^ 0xffffffff;
      }
      local_170 = (GCtab *)(ulong)(&(in_stack_fffffffffffffe40->cur).nextgc)[uVar6 + 0x16].gcptr32;
      if (local_170 == (GCtab *)0x0) {
        in_RSI[0xf] = 0x7fff;
        return 0;
      }
      if ((in_RSI[0xc] & 0x1f000000) == 0xa000000) {
LAB_00150ae7:
        IVar7 = (IRType)((ulong)in_stack_fffffffffffffe40 >> 0x20);
        pcVar5 = lj_tab_getstr(local_170,
                               (GCstr *)(ulong)*(uint *)((long)in_RDI + (ulong)in_EDX * 4 + -0x98));
        if ((pcVar5 == (cTValue *)0x0) || ((pcVar5->field_2).it == 0xffffffff)) {
          return 0;
        }
        if (((pcVar5->field_2).it != 0xfffffff7) && ((pcVar5->field_2).it != 0xfffffff4)) {
          lj_trace_err((jit_State *)
                       CONCAT44(in_stack_fffffffffffffe34,
                                CONCAT22(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30)),
                       (TraceError)((ulong)in_stack_fffffffffffffe28 >> 0x20));
        }
        ((cTValue *)(in_RSI + 6))->field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)pcVar5;
        TVar4 = lj_ir_kgc((jit_State *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)
                          ,in_stack_fffffffffffffe48,IVar7);
        in_RSI[0x10] = TVar4;
        *(GCtab **)(in_RSI + 8) = local_170;
        in_RSI[0xf] = 0x7fff;
        return 1;
      }
      TVar4 = lj_ir_kgc((jit_State *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50),
                        in_stack_fffffffffffffe48,(IRType)((ulong)in_stack_fffffffffffffe40 >> 0x20)
                       );
      IVar7 = (IRType)((ulong)in_stack_fffffffffffffe40 >> 0x20);
      in_RSI[0xf] = TVar4;
      goto LAB_00150ea1;
    }
    local_170 = (GCtab *)(ulong)*(uint *)((ulong)*in_RSI + 0x10);
    if (*(char *)((ulong)*in_RSI + 6) != '\0') {
      if (*(char *)((ulong)*in_RSI + 6) == '\x02') {
        uVar6 = in_RSI[0xc];
        TVar4 = lj_ir_kptr_((jit_State *)
                            CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50),
                            (IROp)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                            in_stack_fffffffffffffe40);
        *(undefined2 *)((long)in_RDI + 0x9c) = 0x885;
        *(short *)((long)in_RDI + 0x98) = (short)uVar6;
        *(short *)((long)in_RDI + 0x9a) = (short)TVar4;
        lj_opt_fold((jit_State *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      }
      else {
        uVar6 = in_RSI[0xc];
        *(undefined2 *)((long)in_RDI + 0x9c) = 0x4310;
        *(short *)((long)in_RDI + 0x98) = (short)uVar6;
        *(undefined2 *)((long)in_RDI + 0x9a) = 10;
        TVar4 = lj_opt_fold((jit_State *)
                            CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        in_stack_fffffffffffffe56 = (undefined2)TVar4;
        in_stack_fffffffffffffe48 = in_RDI;
        TVar4 = lj_ir_kint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
        *(undefined2 *)((long)in_stack_fffffffffffffe48 + 0x9c) = 0x893;
        *(undefined2 *)((long)in_stack_fffffffffffffe48 + 0x98) = in_stack_fffffffffffffe56;
        *(short *)((long)in_stack_fffffffffffffe48 + 0x9a) = (short)TVar4;
        lj_opt_fold((jit_State *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      }
      goto LAB_00150ae7;
    }
    uVar6 = in_RSI[0xc];
    *(undefined2 *)((long)in_RDI + 0x9c) = 0x430b;
    *(short *)((long)in_RDI + 0x98) = (short)uVar6;
    *(undefined2 *)((long)in_RDI + 0x9a) = 9;
    local_138 = lj_opt_fold((jit_State *)
                            CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  uVar6 = local_138;
  if (local_170 == (GCtab *)0x0) {
    uVar6 = 0x7fff;
  }
  in_RSI[0xf] = uVar6;
  sVar1 = 8;
  if (local_170 != (GCtab *)0x0) {
    sVar1 = 9;
  }
  uVar2 = sVar1 << 8 | 0x8b;
  uVar3 = (undefined2)local_138;
  TVar4 = lj_ir_knull(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
  IVar7 = (IRType)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  *(ushort *)((long)in_RDI + 0x9c) = uVar2;
  *(undefined2 *)((long)in_RDI + 0x98) = uVar3;
  *(short *)((long)in_RDI + 0x9a) = (short)TVar4;
  lj_opt_fold((jit_State *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
LAB_00150ea1:
  if (local_170 == (GCtab *)0x0) {
    local_104 = 0;
  }
  else {
    pcVar5 = lj_tab_getstr(local_170,
                           (GCstr *)(ulong)*(uint *)((long)in_RDI + (ulong)in_EDX * 4 + -0x98));
    if ((pcVar5 != (cTValue *)0x0) && ((pcVar5->field_2).it != 0xffffffff)) {
      *(cTValue *)(in_RSI + 6) = *pcVar5;
    }
    *(GCtab **)(in_RSI + 8) = local_170;
    lj_ir_kgc((jit_State *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50),
              in_stack_fffffffffffffe48,IVar7);
    TVar4 = lj_record_idx((jit_State *)CONCAT44(in_EDX,in_stack_fffffffffffffee0),
                          (RecordIndex *)(ulong)in_stack_fffffffffffffed8);
    in_RSI[0x10] = TVar4;
    local_104 = (uint)(((in_RSI[0x10] & 0x1f000000) == 0 ^ 0xffU) & 1);
  }
  return local_104;
}

Assistant:

int lj_record_mm_lookup(jit_State *J, RecordIndex *ix, MMS mm)
{
  RecordIndex mix;
  GCtab *mt;
  if (tref_istab(ix->tab)) {
    mt = tabref(tabV(&ix->tabv)->metatable);
    mix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
  } else if (tref_isudata(ix->tab)) {
    int udtype = udataV(&ix->tabv)->udtype;
    mt = tabref(udataV(&ix->tabv)->metatable);
    /* The metatables of special userdata objects are treated as immutable. */
    if (udtype != UDTYPE_USERDATA) {
      cTValue *mo;
      if (LJ_HASFFI && udtype == UDTYPE_FFI_CLIB) {
	/* Specialize to the C library namespace object. */
	emitir(IRTG(IR_EQ, IRT_P32), ix->tab, lj_ir_kptr(J, udataV(&ix->tabv)));
      } else {
	/* Specialize to the type of userdata. */
	TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), ix->tab, IRFL_UDATA_UDTYPE);
	emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, udtype));
      }
  immutable_mt:
      mo = lj_tab_getstr(mt, mmname_str(J2G(J), mm));
      if (!mo || tvisnil(mo))
	return 0;  /* No metamethod. */
      /* Treat metamethod or index table as immutable, too. */
      if (!(tvisfunc(mo) || tvistab(mo)))
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      copyTV(J->L, &ix->mobjv, mo);
      ix->mobj = lj_ir_kgc(J, gcV(mo), tvisfunc(mo) ? IRT_FUNC : IRT_TAB);
      ix->mtv = mt;
      ix->mt = TREF_NIL;  /* Dummy value for comparison semantics. */
      return 1;  /* Got metamethod or index table. */
    }
    mix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_UDATA_META);
  } else {
    /* Specialize to base metatable. Must flush mcode in lua_setmetatable(). */
    mt = tabref(basemt_obj(J2G(J), &ix->tabv));
    if (mt == NULL) {
      ix->mt = TREF_NIL;
      return 0;  /* No metamethod. */
    }
    /* The cdata metatable is treated as immutable. */
    if (LJ_HASFFI && tref_iscdata(ix->tab)) goto immutable_mt;
    ix->mt = mix.tab = lj_ir_ktab(J, mt);
    goto nocheck;
  }
  ix->mt = mt ? mix.tab : TREF_NIL;
  emitir(IRTG(mt ? IR_NE : IR_EQ, IRT_TAB), mix.tab, lj_ir_knull(J, IRT_TAB));
nocheck:
  if (mt) {
    GCstr *mmstr = mmname_str(J2G(J), mm);
    cTValue *mo = lj_tab_getstr(mt, mmstr);
    if (mo && !tvisnil(mo))
      copyTV(J->L, &ix->mobjv, mo);
    ix->mtv = mt;
    settabV(J->L, &mix.tabv, mt);
    setstrV(J->L, &mix.keyv, mmstr);
    mix.key = lj_ir_kstr(J, mmstr);
    mix.val = 0;
    mix.idxchain = 0;
    ix->mobj = lj_record_idx(J, &mix);
    return !tref_isnil(ix->mobj);  /* 1 if metamethod found, 0 if not. */
  }
  return 0;  /* No metamethod. */
}